

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

OrphanBuilder *
capnp::_::WireHelpers::disown
          (OrphanBuilder *__return_storage_ptr__,SegmentBuilder *segment,CapTableBuilder *capTable,
          WirePointer *ref)

{
  uint uVar1;
  WirePointer *pWVar2;
  uint *puVar3;
  
  uVar1 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef == (StructRef)0x0 && uVar1 == 0) {
    pWVar2 = (WirePointer *)0x0;
  }
  else if ((uVar1 & 3) == 3) {
    pWVar2 = (WirePointer *)0x1;
    if (uVar1 != 3) {
      disown();
    }
  }
  else if ((uVar1 & 3) == 2) {
    segment = BuilderArena::getSegment
                        ((BuilderArena *)(segment->super_SegmentReader).arena,
                         (SegmentId)(ref->field_1).structRef);
    uVar1 = (ref->offsetAndKind).value;
    puVar3 = (uint *)((long)&((segment->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar1 & 0xfffffff8));
    if ((uVar1 & 4) == 0) {
      pWVar2 = (WirePointer *)(puVar3 + (long)((int)*puVar3 >> 2) * 2 + 2);
    }
    else {
      segment = BuilderArena::getSegment
                          ((BuilderArena *)(segment->super_SegmentReader).arena,(SegmentId)puVar3[1]
                          );
      pWVar2 = (WirePointer *)
               ((long)&((segment->super_SegmentReader).ptr.ptr)->content +
               (ulong)(*puVar3 & 0xfffffff8));
    }
  }
  else {
    pWVar2 = ref + (long)((int)uVar1 >> 2) + 1;
  }
  __return_storage_ptr__->segment = segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = (word *)pWVar2;
  (__return_storage_ptr__->tag).content = (uint64_t)*ref;
  uVar1 = (ref->offsetAndKind).value;
  if (((uVar1 & 2) == 0) && ((ref->field_1).upper32Bits != 0 || uVar1 != 0)) {
    *(uint *)&(__return_storage_ptr__->tag).content = uVar1 | 0xfffffffc;
  }
  ref->offsetAndKind = 0;
  ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  return __return_storage_ptr__;
}

Assistant:

static OrphanBuilder disown(SegmentBuilder* segment, CapTableBuilder* capTable,
                              WirePointer* ref) {
    word* location;

    if (ref->isNull()) {
      location = nullptr;
    } else if (ref->kind() == WirePointer::OTHER) {
      KJ_REQUIRE(ref->isCapability(), "Unknown pointer type.") { break; }
      location = reinterpret_cast<word*>(1);  // dummy so that it is non-null
    } else {
      WirePointer* refCopy = ref;
      location = followFarsNoWritableCheck(refCopy, ref->target(), segment);
    }

    OrphanBuilder result(ref, segment, capTable, location);

    if (!ref->isNull() && ref->isPositional()) {
      result.tagAsPtr()->setKindForOrphan(ref->kind());
    }

    // Zero out the pointer that was disowned.
    zeroMemory(ref);

    return result;
  }